

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  uint uVar2;
  char *pcVar3;
  int in_EDX;
  double *in_RSI;
  uint *in_RDI;
  double dVar4;
  int32_t k;
  lua_Number num;
  MSize len;
  GCstr *str;
  char *p;
  MSize in_stack_ffffffffffffff6c;
  SBuf *in_stack_ffffffffffffff70;
  uint local_68;
  char *local_20;
  byte *local_8;
  
  if (in_RDI[1] - *in_RDI < 0xb) {
    local_8 = (byte *)lj_buf_more2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  else {
    local_8 = (byte *)(ulong)*in_RDI;
  }
  if (*(int *)((long)in_RSI + 4) == -5) {
    uVar2 = *(uint *)in_RSI;
    local_68 = *(uint *)((ulong)uVar2 + 0xc);
    if (in_RDI[1] - *in_RDI < local_68 + 5) {
      local_20 = lj_buf_more2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    else {
      local_20 = (char *)(ulong)*in_RDI;
    }
    pcVar3 = lj_strfmt_wuleb128(local_20,local_68 + 5);
    memcpy(pcVar3,(void *)((ulong)uVar2 + 0x10),(ulong)local_68);
    local_68 = (int)pcVar3 + local_68;
  }
  else if (*(uint *)((long)in_RSI + 4) < 0xfffeffff) {
    if (in_EDX != 0) {
      dVar1 = *in_RSI;
      dVar4 = (double)(int)dVar1;
      if ((dVar1 == dVar4) && (!NAN(dVar1) && !NAN(dVar4))) {
        *local_8 = 3;
        pcVar3 = lj_strfmt_wuleb128((char *)(local_8 + 1),(int)dVar1);
        *in_RDI = (uint)pcVar3;
        return;
      }
    }
    *local_8 = 4;
    pcVar3 = lj_strfmt_wuleb128((char *)(local_8 + 1),*(uint32_t *)in_RSI);
    pcVar3 = lj_strfmt_wuleb128(pcVar3,*(uint32_t *)((long)in_RSI + 4));
    local_68 = (uint)pcVar3;
  }
  else {
    local_68 = (int)local_8 + 1;
    *local_8 = (byte)*(undefined4 *)((long)in_RSI + 4) ^ 0xff;
  }
  *in_RDI = local_68;
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  char *p = lj_buf_more(&ctx->sb, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    p = lj_buf_more(&ctx->sb, 5+len);
    p = lj_strfmt_wuleb128(p, BCDUMP_KTAB_STR+len);
    p = lj_buf_wmem(p, strdata(str), len);
  } else if (tvisint(o)) {
    *p++ = BCDUMP_KTAB_INT;
    p = lj_strfmt_wuleb128(p, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	*p++ = BCDUMP_KTAB_INT;
	p = lj_strfmt_wuleb128(p, k);
	setsbufP(&ctx->sb, p);
	return;
      }
    }
    *p++ = BCDUMP_KTAB_NUM;
    p = lj_strfmt_wuleb128(p, o->u32.lo);
    p = lj_strfmt_wuleb128(p, o->u32.hi);
  } else {
    lj_assertBCW(tvispri(o), "unhandled type %d", itype(o));
    *p++ = BCDUMP_KTAB_NIL+~itype(o);
  }
  setsbufP(&ctx->sb, p);
}